

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempdir.cpp
# Opt level: O0

string * fs_get_tempdir_abi_cxx11_(void)

{
  bool bVar1;
  string *in_RDI;
  string_view local_c0;
  string_view local_b0;
  allocator<char> local_99;
  __sv_type local_98;
  string_view local_88;
  undefined1 local_78 [8];
  string t;
  undefined1 local_48 [8];
  path p;
  error_code ec;
  
  std::error_code::error_code((error_code *)&p._M_cmpts);
  std::filesystem::temp_directory_path_abi_cxx11_((error_code *)local_48);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&p._M_cmpts);
  if (!bVar1) {
    bVar1 = std::filesystem::__cxx11::path::empty((path *)local_48);
    if (!bVar1) {
      std::filesystem::__cxx11::path::generic_string(in_RDI,(path *)local_48);
      t.field_2._8_4_ = 1;
      goto LAB_00121613;
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"TMPDIR");
  fs_getenv_abi_cxx11_((string *)local_78,local_88);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  if (bVar1) {
    bVar1 = fs_is_dir("/tmp");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"/tmp",&local_99);
      std::allocator<char>::~allocator(&local_99);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_c0,"fs_get_tempdir");
      fs_print_error(local_b0,local_c0,(error_code *)&p._M_cmpts);
      std::__cxx11::string::string((string *)in_RDI);
    }
  }
  else {
    local_98 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
    fs_as_posix_abi_cxx11_(in_RDI,local_98);
  }
  t.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_78);
LAB_00121613:
  std::filesystem::__cxx11::path::~path((path *)local_48);
  return in_RDI;
}

Assistant:

std::string fs_get_tempdir()
{
  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  auto p = std::filesystem::temp_directory_path(ec);
  if(!ec && !p.empty()) FFS_LIKELY
    return p.generic_string();
#endif

#if defined(_WIN32)
  // GetTempPath2A is not in MSYS2
  std::string t(fs_get_max_path(), '\0');
  auto L = GetTempPathA(static_cast<DWORD>(t.size()), t.data());
  if (L > 0)  FFS_LIKELY
    t.resize(L);
#else
  std::string t(fs_getenv("TMPDIR"));
#endif

  if(!t.empty()) FFS_LIKELY
    return fs_as_posix(t);

  if (fs_is_dir("/tmp"))
    return "/tmp";

  fs_print_error("", __func__, ec);
  return {};
}